

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O1

void embree::avx::SphereMiMBIntersectorK<4,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  float fVar1;
  Geometry *pGVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  RayHitK<8> *pRVar17;
  ulong uVar19;
  long lVar20;
  Scene *pSVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  float fVar32;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  float fVar43;
  float fVar47;
  float fVar48;
  undefined1 auVar44 [16];
  float fVar49;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [64];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  vbool<4> valid;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<4> hit;
  HitK<8> h;
  undefined1 local_360 [16];
  Scene *local_350;
  RayQueryContext *local_348;
  undefined1 local_340 [16];
  Primitive *local_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined1 local_300 [16];
  undefined8 *local_2f0;
  void *local_2e8;
  RTCRayQueryContext *local_2e0;
  RayHitK<8> *local_2d8;
  undefined1 (*local_2d0) [32];
  undefined4 local_2c8;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [32];
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  undefined4 local_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar18;
  undefined1 auVar64 [64];
  undefined1 auVar66 [64];
  
  pSVar21 = context->scene;
  pGVar2 = (pSVar21->geometries).items[sphere->sharedGeomID].ptr;
  fVar1 = (pGVar2->time_range).lower;
  fVar1 = pGVar2->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0xe0) - fVar1) / ((pGVar2->time_range).upper - fVar1));
  auVar52 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
  auVar52 = vminss_avx(auVar52,ZEXT416((uint)(pGVar2->fnumTimeSegments + -1.0)));
  auVar54 = vmaxss_avx(ZEXT816(0) << 0x20,auVar52);
  uVar19 = (ulong)(sphere->primIDs).field_0.i[0];
  lVar24 = *(long *)&pGVar2[2].numPrimitives;
  lVar20 = (long)(int)auVar54._0_4_ * 0x38;
  lVar3 = *(long *)(lVar24 + lVar20);
  lVar4 = *(long *)(lVar24 + 0x10 + lVar20);
  auVar52 = *(undefined1 (*) [16])(lVar3 + lVar4 * uVar19);
  uVar18 = (ulong)(sphere->primIDs).field_0.i[1];
  auVar36 = *(undefined1 (*) [16])(lVar3 + lVar4 * uVar18);
  uVar22 = (ulong)(sphere->primIDs).field_0.i[2];
  auVar50 = *(undefined1 (*) [16])(lVar3 + lVar4 * uVar22);
  uVar23 = (ulong)(sphere->primIDs).field_0.i[3];
  auVar63 = *(undefined1 (*) [16])(lVar3 + lVar4 * uVar23);
  lVar3 = *(long *)(lVar24 + 0x38 + lVar20);
  lVar24 = *(long *)(lVar24 + 0x48 + lVar20);
  auVar75 = *(undefined1 (*) [16])(lVar3 + uVar19 * lVar24);
  auVar51 = *(undefined1 (*) [16])(lVar3 + uVar18 * lVar24);
  auVar33 = *(undefined1 (*) [16])(lVar3 + uVar22 * lVar24);
  auVar53 = *(undefined1 (*) [16])(lVar3 + lVar24 * uVar23);
  fVar1 = fVar1 - auVar54._0_4_;
  auVar54 = vunpcklps_avx(auVar52,auVar50);
  auVar52 = vunpckhps_avx(auVar52,auVar50);
  auVar50 = vunpcklps_avx(auVar36,auVar63);
  auVar36 = vunpckhps_avx(auVar36,auVar63);
  auVar58 = vunpcklps_avx(auVar54,auVar50);
  auVar50 = vunpckhps_avx(auVar54,auVar50);
  auVar54 = vunpcklps_avx(auVar52,auVar36);
  auVar63 = vunpckhps_avx(auVar52,auVar36);
  auVar44 = vunpcklps_avx(auVar75,auVar33);
  auVar52 = vunpckhps_avx(auVar75,auVar33);
  auVar75 = vunpcklps_avx(auVar51,auVar53);
  auVar36 = vunpckhps_avx(auVar51,auVar53);
  auVar33 = vunpcklps_avx(auVar44,auVar75);
  auVar75 = vunpckhps_avx(auVar44,auVar75);
  auVar53 = vunpcklps_avx(auVar52,auVar36);
  auVar51 = vunpckhps_avx(auVar52,auVar36);
  auVar52 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
  auVar36 = vshufps_avx(ZEXT416((uint)(1.0 - fVar1)),ZEXT416((uint)(1.0 - fVar1)),0);
  auVar44._8_4_ = 0x3f800000;
  auVar44._0_8_ = &DAT_3f8000003f800000;
  auVar44._12_4_ = 0x3f800000;
  fVar1 = auVar52._0_4_;
  fVar5 = auVar52._4_4_;
  fVar6 = auVar52._8_4_;
  fVar42 = auVar52._12_4_;
  fVar32 = auVar36._0_4_;
  fVar40 = auVar36._4_4_;
  fVar41 = auVar36._8_4_;
  fVar43 = auVar36._12_4_;
  auVar62._0_4_ = auVar33._0_4_ * fVar1 + fVar32 * auVar58._0_4_;
  auVar62._4_4_ = auVar33._4_4_ * fVar5 + fVar40 * auVar58._4_4_;
  auVar62._8_4_ = auVar33._8_4_ * fVar6 + fVar41 * auVar58._8_4_;
  auVar62._12_4_ = auVar33._12_4_ * fVar42 + fVar43 * auVar58._12_4_;
  auVar67._0_4_ = auVar75._0_4_ * fVar1 + fVar32 * auVar50._0_4_;
  auVar67._4_4_ = auVar75._4_4_ * fVar5 + fVar40 * auVar50._4_4_;
  auVar67._8_4_ = auVar75._8_4_ * fVar6 + fVar41 * auVar50._8_4_;
  auVar67._12_4_ = auVar75._12_4_ * fVar42 + fVar43 * auVar50._12_4_;
  auVar58._0_4_ = auVar53._0_4_ * fVar1 + fVar32 * auVar54._0_4_;
  auVar58._4_4_ = auVar53._4_4_ * fVar5 + fVar40 * auVar54._4_4_;
  auVar58._8_4_ = auVar53._8_4_ * fVar6 + fVar41 * auVar54._8_4_;
  auVar58._12_4_ = auVar53._12_4_ * fVar42 + fVar43 * auVar54._12_4_;
  fVar32 = fVar32 * auVar63._0_4_ + fVar1 * auVar51._0_4_;
  fVar40 = fVar40 * auVar63._4_4_ + fVar5 * auVar51._4_4_;
  fVar41 = fVar41 * auVar63._8_4_ + fVar6 * auVar51._8_4_;
  fVar42 = fVar43 * auVar63._12_4_ + fVar42 * auVar51._12_4_;
  auVar52 = vpshufd_avx(ZEXT116(sphere->numPrimitives),0);
  auVar36 = vpcmpgtd_avx(auVar52,_DAT_01ff0cf0);
  local_190 = vpshufd_avx(ZEXT416(sphere->sharedGeomID),0);
  uVar16 = *(undefined4 *)(ray + k * 4);
  auVar52._4_4_ = uVar16;
  auVar52._0_4_ = uVar16;
  auVar52._8_4_ = uVar16;
  auVar52._12_4_ = uVar16;
  auVar63 = vsubps_avx(auVar62,auVar52);
  uVar16 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar50._4_4_ = uVar16;
  auVar50._0_4_ = uVar16;
  auVar50._8_4_ = uVar16;
  auVar50._12_4_ = uVar16;
  auVar75 = vsubps_avx(auVar67,auVar50);
  uVar16 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar51._4_4_ = uVar16;
  auVar51._0_4_ = uVar16;
  auVar51._8_4_ = uVar16;
  auVar51._12_4_ = uVar16;
  auVar51 = vsubps_avx(auVar58,auVar51);
  fVar1 = *(float *)(ray + k * 4 + 0x80);
  auVar74 = ZEXT1664(CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))));
  fVar5 = *(float *)(ray + k * 4 + 0xa0);
  auVar76 = ZEXT1664(CONCAT412(fVar5,CONCAT48(fVar5,CONCAT44(fVar5,fVar5))));
  fVar6 = *(float *)(ray + k * 4 + 0xc0);
  auVar77 = ZEXT1664(CONCAT412(fVar6,CONCAT48(fVar6,CONCAT44(fVar6,fVar6))));
  auVar52 = ZEXT416((uint)(fVar1 * fVar1 + fVar5 * fVar5 + fVar6 * fVar6));
  auVar50 = vshufps_avx(auVar52,auVar52,0);
  auVar52 = vrcpps_avx(auVar50);
  fVar43 = auVar52._0_4_;
  auVar53._0_4_ = fVar43 * auVar50._0_4_;
  fVar47 = auVar52._4_4_;
  auVar53._4_4_ = fVar47 * auVar50._4_4_;
  fVar48 = auVar52._8_4_;
  auVar53._8_4_ = fVar48 * auVar50._8_4_;
  fVar49 = auVar52._12_4_;
  auVar53._12_4_ = fVar49 * auVar50._12_4_;
  auVar52 = vsubps_avx(auVar44,auVar53);
  fVar43 = fVar43 + fVar43 * auVar52._0_4_;
  fVar47 = fVar47 + fVar47 * auVar52._4_4_;
  fVar48 = fVar48 + fVar48 * auVar52._8_4_;
  fVar49 = fVar49 + fVar49 * auVar52._12_4_;
  auVar54._0_4_ = (fVar1 * auVar63._0_4_ + fVar5 * auVar75._0_4_ + fVar6 * auVar51._0_4_) * fVar43;
  auVar54._4_4_ = (fVar1 * auVar63._4_4_ + fVar5 * auVar75._4_4_ + fVar6 * auVar51._4_4_) * fVar47;
  auVar54._8_4_ = (fVar1 * auVar63._8_4_ + fVar5 * auVar75._8_4_ + fVar6 * auVar51._8_4_) * fVar48;
  auVar54._12_4_ =
       (fVar1 * auVar63._12_4_ + fVar5 * auVar75._12_4_ + fVar6 * auVar51._12_4_) * fVar49;
  auVar68._0_4_ = fVar1 * auVar54._0_4_;
  auVar68._4_4_ = fVar1 * auVar54._4_4_;
  auVar68._8_4_ = fVar1 * auVar54._8_4_;
  auVar68._12_4_ = fVar1 * auVar54._12_4_;
  auVar70._0_4_ = fVar5 * auVar54._0_4_;
  auVar70._4_4_ = fVar5 * auVar54._4_4_;
  auVar70._8_4_ = fVar5 * auVar54._8_4_;
  auVar70._12_4_ = fVar5 * auVar54._12_4_;
  auVar72._0_4_ = fVar6 * auVar54._0_4_;
  auVar72._4_4_ = fVar6 * auVar54._4_4_;
  auVar72._8_4_ = fVar6 * auVar54._8_4_;
  auVar72._12_4_ = fVar6 * auVar54._12_4_;
  auVar50 = vsubps_avx(auVar63,auVar68);
  auVar69 = ZEXT1664(auVar50);
  auVar63 = vsubps_avx(auVar75,auVar70);
  auVar71 = ZEXT1664(auVar63);
  auVar75 = vsubps_avx(auVar51,auVar72);
  auVar73 = ZEXT1664(auVar75);
  auVar59._0_4_ =
       auVar50._0_4_ * auVar50._0_4_ + auVar63._0_4_ * auVar63._0_4_ + auVar75._0_4_ * auVar75._0_4_
  ;
  auVar59._4_4_ =
       auVar50._4_4_ * auVar50._4_4_ + auVar63._4_4_ * auVar63._4_4_ + auVar75._4_4_ * auVar75._4_4_
  ;
  auVar59._8_4_ =
       auVar50._8_4_ * auVar50._8_4_ + auVar63._8_4_ * auVar63._8_4_ + auVar75._8_4_ * auVar75._8_4_
  ;
  auVar59._12_4_ =
       auVar50._12_4_ * auVar50._12_4_ +
       auVar63._12_4_ * auVar63._12_4_ + auVar75._12_4_ * auVar75._12_4_;
  auVar33._0_4_ = fVar32 * fVar32;
  auVar33._4_4_ = fVar40 * fVar40;
  auVar33._8_4_ = fVar41 * fVar41;
  auVar33._12_4_ = fVar42 * fVar42;
  auVar52 = vcmpps_avx(auVar59,auVar33,2);
  auVar51 = auVar36 & auVar52;
  if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar51[0xf] < '\0') {
    auVar52 = vandps_avx(auVar52,auVar36);
    auVar36 = vsubps_avx(auVar33,auVar59);
    auVar34._0_4_ = fVar43 * auVar36._0_4_;
    auVar34._4_4_ = fVar47 * auVar36._4_4_;
    auVar34._8_4_ = fVar48 * auVar36._8_4_;
    auVar34._12_4_ = fVar49 * auVar36._12_4_;
    auVar53 = vsqrtps_avx(auVar34);
    auVar78 = ZEXT1664(auVar53);
    auVar58 = vsubps_avx(auVar54,auVar53);
    auVar65._0_4_ = auVar53._0_4_ + auVar54._0_4_;
    auVar65._4_4_ = auVar53._4_4_ + auVar54._4_4_;
    auVar65._8_4_ = auVar53._8_4_ + auVar54._8_4_;
    auVar65._12_4_ = auVar53._12_4_ + auVar54._12_4_;
    auVar66 = ZEXT1664(auVar65);
    uVar16 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar55._4_4_ = uVar16;
    auVar55._0_4_ = uVar16;
    auVar55._8_4_ = uVar16;
    auVar55._12_4_ = uVar16;
    auVar36 = vcmpps_avx(auVar55,auVar58,2);
    uVar16 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar60._4_4_ = uVar16;
    auVar60._0_4_ = uVar16;
    auVar60._8_4_ = uVar16;
    auVar60._12_4_ = uVar16;
    auVar51 = vcmpps_avx(auVar58,auVar60,2);
    auVar36 = vandps_avx(auVar51,auVar36);
    auVar79 = ZEXT1664(auVar36);
    auVar36 = vandps_avx(auVar36,auVar52);
    auVar51 = vcmpps_avx(auVar55,auVar65,2);
    auVar33 = vcmpps_avx(auVar65,auVar60,2);
    auVar51 = vandps_avx(auVar51,auVar33);
    auVar52 = vandps_avx(auVar51,auVar52);
    auVar80 = ZEXT1664(auVar52);
    local_360 = vorps_avx(auVar52,auVar36);
    if ((((local_360 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (local_360 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (local_360 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        local_360[0xf] < '\0') {
      local_2c0 = vblendvps_avx(auVar65,auVar58,auVar36);
      auVar61 = ZEXT1664(local_2c0);
      auVar35._0_8_ = auVar53._0_8_ ^ 0x8000000080000000;
      auVar35._8_4_ = -auVar53._8_4_;
      auVar35._12_4_ = -auVar53._12_4_;
      auVar52 = vblendvps_avx(auVar53,auVar35,auVar36);
      fVar42 = auVar52._0_4_;
      auVar45._0_4_ = fVar1 * fVar42;
      fVar32 = auVar52._4_4_;
      auVar45._4_4_ = fVar1 * fVar32;
      fVar40 = auVar52._8_4_;
      auVar45._8_4_ = fVar1 * fVar40;
      fVar41 = auVar52._12_4_;
      auVar45._12_4_ = fVar1 * fVar41;
      auVar56._0_4_ = fVar5 * fVar42;
      auVar56._4_4_ = fVar5 * fVar32;
      auVar56._8_4_ = fVar5 * fVar40;
      auVar56._12_4_ = fVar5 * fVar41;
      auVar36._0_4_ = fVar6 * fVar42;
      auVar36._4_4_ = fVar6 * fVar32;
      auVar36._8_4_ = fVar6 * fVar40;
      auVar36._12_4_ = fVar6 * fVar41;
      local_2b0 = vsubps_avx(auVar45,auVar50);
      local_2a0 = vsubps_avx(auVar56,auVar63);
      local_290 = vsubps_avx(auVar36,auVar75);
      auVar63._8_4_ = 0x7f800000;
      auVar63._0_8_ = 0x7f8000007f800000;
      auVar63._12_4_ = 0x7f800000;
      auVar64 = ZEXT1664(auVar63);
      auVar52 = vblendvps_avx(auVar63,local_2c0,local_360);
      auVar36 = vshufps_avx(auVar52,auVar52,0xb1);
      auVar36 = vminps_avx(auVar36,auVar52);
      auVar50 = vshufpd_avx(auVar36,auVar36,1);
      auVar36 = vminps_avx(auVar50,auVar36);
      auVar52 = vcmpps_avx(auVar52,auVar36,0);
      auVar50 = local_360 & auVar52;
      auVar36 = vpcmpeqd_avx(auVar36,auVar36);
      if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar50[0xf] < '\0'
         ) {
        auVar36 = auVar52;
      }
      auVar52 = vandps_avx(local_360,auVar36);
      uVar14 = vmovmskps_avx(auVar52);
      lVar24 = 0;
      if (uVar14 != 0) {
        for (; (uVar14 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
        }
      }
      uVar14 = 1 << ((byte)k & 0x1f);
      uVar19 = (ulong)((uVar14 & 0xf) << 4);
      local_1c0._0_8_ = mm_lookupmask_ps + (long)((int)uVar14 >> 4) * 0x10;
      local_280 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      local_350 = pSVar21;
      local_348 = context;
      do {
        auVar50 = auVar73._0_16_;
        auVar52 = auVar69._0_16_;
        local_2d0 = &local_180;
        auVar36 = auVar71._0_16_;
        auVar51 = auVar77._0_16_;
        auVar75 = auVar76._0_16_;
        auVar33 = auVar78._0_16_;
        auVar63 = auVar74._0_16_;
        auVar54 = auVar80._0_16_;
        auVar53 = auVar79._0_16_;
        uVar14 = *(uint *)(local_190 + lVar24 * 4);
        pRVar17 = (RayHitK<8> *)(ulong)uVar14;
        pGVar2 = (pSVar21->geometries).items[(long)pRVar17].ptr;
        local_2d8 = ray;
        if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          *(undefined4 *)(local_360 + lVar24 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar2->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + lVar24 * 4);
            *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_2b0 + lVar24 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_2a0 + lVar24 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_290 + lVar24 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1e0) = 0;
            *(undefined4 *)(ray + k * 4 + 0x200) = 0;
            *(uint *)(ray + k * 4 + 0x220) = (sphere->primIDs).field_0.i[lVar24];
            *(uint *)(ray + k * 4 + 0x240) = uVar14;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            uVar16 = 0;
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
LAB_00fb780b:
            uVar15 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar26._4_4_ = uVar15;
            auVar26._0_4_ = uVar15;
            auVar26._8_4_ = uVar15;
            auVar26._12_4_ = uVar15;
            local_2c0 = auVar66._0_16_;
            auVar58 = vcmpps_avx(local_2c0,auVar26,2);
            auVar53 = vandps_avx(auVar53,auVar58);
            auVar58 = auVar54 & auVar53;
            if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar58 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar58 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar58[0xf]) {
              return;
            }
            local_360 = vandps_avx(auVar54,auVar53);
            fVar1 = auVar33._0_4_;
            auVar37._0_4_ = auVar63._0_4_ * fVar1;
            fVar5 = auVar33._4_4_;
            auVar37._4_4_ = auVar63._4_4_ * fVar5;
            fVar6 = auVar33._8_4_;
            auVar37._8_4_ = auVar63._8_4_ * fVar6;
            fVar42 = auVar33._12_4_;
            auVar37._12_4_ = auVar63._12_4_ * fVar42;
            auVar46._0_4_ = auVar75._0_4_ * fVar1;
            auVar46._4_4_ = auVar75._4_4_ * fVar5;
            auVar46._8_4_ = auVar75._8_4_ * fVar6;
            auVar46._12_4_ = auVar75._12_4_ * fVar42;
            auVar57._0_4_ = auVar51._0_4_ * fVar1;
            auVar57._4_4_ = auVar51._4_4_ * fVar5;
            auVar57._8_4_ = auVar51._8_4_ * fVar6;
            auVar57._12_4_ = auVar51._12_4_ * fVar42;
            local_2b0 = vsubps_avx(auVar37,auVar52);
            local_2a0 = vsubps_avx(auVar46,auVar36);
            local_290 = vsubps_avx(auVar57,auVar50);
            pSVar21 = context->scene;
            auVar52 = vblendvps_avx(auVar64._0_16_,local_2c0,local_360);
            auVar36 = vshufps_avx(auVar52,auVar52,0xb1);
            auVar36 = vminps_avx(auVar36,auVar52);
            auVar50 = vshufpd_avx(auVar36,auVar36,1);
            auVar36 = vminps_avx(auVar50,auVar36);
            auVar36 = vcmpps_avx(auVar52,auVar36,0);
            auVar50 = local_360 & auVar36;
            auVar52 = local_360;
            if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar50[0xf] < '\0') {
              auVar52 = vandps_avx(auVar36,local_360);
            }
            uVar15 = vmovmskps_avx(auVar52);
            lVar24 = 0;
            if (CONCAT44(uVar16,uVar15) != 0) {
              for (; (CONCAT44(uVar16,uVar15) >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
              }
            }
            uVar14 = 1 << ((byte)k & 0x1f);
            uVar19 = (ulong)((uVar14 & 0xf) << 4);
            local_350 = (Scene *)(mm_lookupmask_ps + (long)((int)uVar14 >> 4) * 0x10);
            auVar52 = ZEXT816(0) << 0x40;
            auVar69 = ZEXT1664(auVar52);
            auVar28 = vcmpps_avx(ZEXT1632(auVar52),ZEXT1632(auVar52),0xf);
            auVar71 = ZEXT3264(auVar28);
            auVar73 = ZEXT1664(ZEXT816(0) << 0x40);
            do {
              local_2d0 = &local_180;
              uVar14 = *(uint *)(local_190 + lVar24 * 4);
              pRVar17 = (RayHitK<8> *)(ulong)uVar14;
              pGVar2 = (pSVar21->geometries).items[(long)pRVar17].ptr;
              if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_360 + lVar24 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar2->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + lVar24 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_2b0 + lVar24 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_2a0 + lVar24 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_290 + lVar24 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = 0;
                  *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                  *(uint *)(ray + k * 4 + 0x220) = (sphere->primIDs).field_0.i[lVar24];
                  *(uint *)(ray + k * 4 + 0x240) = uVar14;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  return;
                }
                local_e0 = (sphere->primIDs).field_0.i[lVar24];
                local_180._0_4_ = *(undefined4 *)(local_2b0 + lVar24 * 4);
                local_160 = *(undefined4 *)(local_2a0 + lVar24 * 4);
                auStack_b0 = vpshufd_avx(ZEXT416(uVar14),0);
                uVar16 = *(undefined4 *)(local_290 + lVar24 * 4);
                local_140._4_4_ = uVar16;
                local_140._0_4_ = uVar16;
                local_140._8_4_ = uVar16;
                local_140._12_4_ = uVar16;
                local_140._16_4_ = uVar16;
                local_140._20_4_ = uVar16;
                local_140._24_4_ = uVar16;
                local_140._28_4_ = uVar16;
                local_180._4_4_ = local_180._0_4_;
                local_180._8_4_ = local_180._0_4_;
                local_180._12_4_ = local_180._0_4_;
                local_180._16_4_ = local_180._0_4_;
                local_180._20_4_ = local_180._0_4_;
                local_180._24_4_ = local_180._0_4_;
                local_180._28_4_ = local_180._0_4_;
                uStack_15c = local_160;
                uStack_158 = local_160;
                uStack_154 = local_160;
                uStack_150 = local_160;
                uStack_14c = local_160;
                uStack_148 = local_160;
                uStack_144 = local_160;
                local_100 = auVar69._0_32_;
                local_120 = auVar69._0_32_;
                uStack_dc = local_e0;
                uStack_d8 = local_e0;
                uStack_d4 = local_e0;
                uStack_d0 = local_e0;
                uStack_cc = local_e0;
                uStack_c8 = local_e0;
                uStack_c4 = local_e0;
                local_c0 = auStack_b0;
                local_1c0 = auVar71._0_32_;
                uStack_9c = context->user->instID[0];
                local_a0 = uStack_9c;
                uStack_98 = uStack_9c;
                uStack_94 = uStack_9c;
                uStack_90 = uStack_9c;
                uStack_8c = uStack_9c;
                uStack_88 = uStack_9c;
                uStack_84 = uStack_9c;
                uStack_7c = context->user->instPrimID[0];
                local_80 = uStack_7c;
                uStack_78 = uStack_7c;
                uStack_74 = uStack_7c;
                uStack_70 = uStack_7c;
                uStack_6c = uStack_7c;
                uStack_68 = uStack_7c;
                uStack_64 = uStack_7c;
                uVar16 = *(undefined4 *)(ray + k * 4 + 0x100);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + lVar24 * 4);
                local_320 = *(undefined8 *)(mm_lookupmask_ps + uVar19);
                uStack_318 = *(undefined8 *)(mm_lookupmask_ps + uVar19 + 8);
                local_310 = *(undefined8 *)local_350;
                uStack_308 = *(undefined8 *)((long)local_350 + 8);
                local_2f0 = &local_320;
                local_2e8 = pGVar2->userPtr;
                local_2e0 = context->user;
                local_2c8 = 8;
                pRVar17 = (RayHitK<8> *)pGVar2->intersectionFilterN;
                local_2d8 = ray;
                if (pRVar17 != (RayHitK<8> *)0x0) {
                  local_280._0_8_ = pSVar21;
                  local_340 = auVar66._0_16_;
                  local_300._0_4_ = uVar16;
                  local_328 = sphere;
                  pRVar17 = (RayHitK<8> *)(*(code *)pRVar17)(&local_2f0);
                  auVar73 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar71 = ZEXT3264(local_1c0);
                  auVar69 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar64 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                  auVar66 = ZEXT1664(local_340);
                  context = local_348;
                  sphere = local_328;
                  pSVar21 = (Scene *)local_280._0_8_;
                  uVar16 = local_300._0_4_;
                }
                auVar8._8_8_ = uStack_318;
                auVar8._0_8_ = local_320;
                auVar52 = vpcmpeqd_avx(auVar73._0_16_,auVar8);
                auVar12._8_8_ = uStack_308;
                auVar12._0_8_ = local_310;
                auVar36 = vpcmpeqd_avx(auVar73._0_16_,auVar12);
                auVar30._16_16_ = auVar36;
                auVar30._0_16_ = auVar52;
                local_1c0 = auVar71._0_32_;
                auVar28 = local_1c0 & ~auVar30;
                if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar28 >> 0x7f,0) == '\0') &&
                      (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar28 >> 0xbf,0) == '\0') &&
                    (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar28[0x1f]) {
                  auVar31._0_4_ = auVar71._0_4_ ^ auVar52._0_4_;
                  auVar31._4_4_ = auVar71._4_4_ ^ auVar52._4_4_;
                  auVar31._8_4_ = auVar71._8_4_ ^ auVar52._8_4_;
                  auVar31._12_4_ = auVar71._12_4_ ^ auVar52._12_4_;
                  auVar31._16_4_ = auVar71._16_4_ ^ auVar36._0_4_;
                  auVar31._20_4_ = auVar71._20_4_ ^ auVar36._4_4_;
                  auVar31._24_4_ = auVar71._24_4_ ^ auVar36._8_4_;
                  auVar31._28_4_ = auVar71._28_4_ ^ auVar36._12_4_;
                }
                else {
                  pRVar17 = (RayHitK<8> *)context->args->filter;
                  if ((pRVar17 != (RayHitK<8> *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar2->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    local_280._0_8_ = pSVar21;
                    local_340 = auVar66._0_16_;
                    local_300._0_4_ = uVar16;
                    pRVar17 = (RayHitK<8> *)(*(code *)pRVar17)();
                    auVar73 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar71 = ZEXT3264(local_1c0);
                    auVar69 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar64 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000))
                                      );
                    auVar66 = ZEXT1664(local_340);
                    context = local_348;
                    pSVar21 = (Scene *)local_280._0_8_;
                    uVar16 = local_300._0_4_;
                  }
                  auVar9._8_8_ = uStack_318;
                  auVar9._0_8_ = local_320;
                  auVar52 = vpcmpeqd_avx(auVar73._0_16_,auVar9);
                  auVar13._8_8_ = uStack_308;
                  auVar13._0_8_ = local_310;
                  auVar36 = vpcmpeqd_avx(auVar73._0_16_,auVar13);
                  auVar39._16_16_ = auVar36;
                  auVar39._0_16_ = auVar52;
                  auVar31._0_4_ = auVar71._0_4_ ^ auVar52._0_4_;
                  auVar31._4_4_ = auVar71._4_4_ ^ auVar52._4_4_;
                  auVar31._8_4_ = auVar71._8_4_ ^ auVar52._8_4_;
                  auVar31._12_4_ = auVar71._12_4_ ^ auVar52._12_4_;
                  auVar31._16_4_ = auVar71._16_4_ ^ auVar36._0_4_;
                  auVar31._20_4_ = auVar71._20_4_ ^ auVar36._4_4_;
                  auVar31._24_4_ = auVar71._24_4_ ^ auVar36._8_4_;
                  auVar31._28_4_ = auVar71._28_4_ ^ auVar36._12_4_;
                  auVar28 = auVar71._0_32_ & ~auVar39;
                  if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar28 >> 0x7f,0) != '\0') ||
                        (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar28 >> 0xbf,0) != '\0') ||
                      (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar28[0x1f] < '\0') {
                    auVar28 = vmaskmovps_avx(auVar31,*local_2d0);
                    *(undefined1 (*) [32])(local_2d8 + 0x180) = auVar28;
                    auVar28 = vmaskmovps_avx(auVar31,local_2d0[1]);
                    *(undefined1 (*) [32])(local_2d8 + 0x1a0) = auVar28;
                    auVar28 = vmaskmovps_avx(auVar31,local_2d0[2]);
                    *(undefined1 (*) [32])(local_2d8 + 0x1c0) = auVar28;
                    auVar28 = vmaskmovps_avx(auVar31,local_2d0[3]);
                    *(undefined1 (*) [32])(local_2d8 + 0x1e0) = auVar28;
                    auVar28 = vmaskmovps_avx(auVar31,local_2d0[4]);
                    *(undefined1 (*) [32])(local_2d8 + 0x200) = auVar28;
                    auVar28 = vmaskmovps_avx(auVar31,local_2d0[5]);
                    *(undefined1 (*) [32])(local_2d8 + 0x220) = auVar28;
                    auVar28 = vmaskmovps_avx(auVar31,local_2d0[6]);
                    *(undefined1 (*) [32])(local_2d8 + 0x240) = auVar28;
                    auVar28 = vmaskmovps_avx(auVar31,local_2d0[7]);
                    *(undefined1 (*) [32])(local_2d8 + 0x260) = auVar28;
                    auVar28 = vmaskmovps_avx(auVar31,local_2d0[8]);
                    *(undefined1 (*) [32])(local_2d8 + 0x280) = auVar28;
                    pRVar17 = local_2d8;
                  }
                }
                if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar31 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar31 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar31 >> 0x7f,0) == '\0') &&
                      (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar31 >> 0xbf,0) == '\0') &&
                    (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar31[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar16;
                }
                *(undefined4 *)(local_360 + lVar24 * 4) = 0;
                uVar16 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar27._4_4_ = uVar16;
                auVar27._0_4_ = uVar16;
                auVar27._8_4_ = uVar16;
                auVar27._12_4_ = uVar16;
                auVar52 = vcmpps_avx(auVar66._0_16_,auVar27,2);
                local_360 = vandps_avx(auVar52,local_360);
              }
              if ((((local_360 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_360 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_360 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_360[0xf]) {
                return;
              }
              auVar52 = vblendvps_avx(auVar64._0_16_,auVar66._0_16_,local_360);
              auVar36 = vshufps_avx(auVar52,auVar52,0xb1);
              auVar36 = vminps_avx(auVar36,auVar52);
              auVar50 = vshufpd_avx(auVar36,auVar36,1);
              auVar36 = vminps_avx(auVar50,auVar36);
              auVar36 = vcmpps_avx(auVar52,auVar36,0);
              auVar50 = local_360 & auVar36;
              auVar52 = local_360;
              if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar50[0xf] < '\0') {
                auVar52 = vandps_avx(auVar36,local_360);
              }
              uVar16 = vmovmskps_avx(auVar52);
              uVar18 = CONCAT44((int)((ulong)pRVar17 >> 0x20),uVar16);
              lVar24 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                }
              }
            } while( true );
          }
          local_300 = auVar61._0_16_;
          local_e0 = (sphere->primIDs).field_0.i[lVar24];
          local_180._0_4_ = *(undefined4 *)(local_2b0 + lVar24 * 4);
          local_160 = *(undefined4 *)(local_2a0 + lVar24 * 4);
          auStack_b0 = vpshufd_avx(ZEXT416(uVar14),0);
          local_140._4_4_ = *(undefined4 *)(local_290 + lVar24 * 4);
          local_180._4_4_ = local_180._0_4_;
          local_180._8_4_ = local_180._0_4_;
          local_180._12_4_ = local_180._0_4_;
          local_180._16_4_ = local_180._0_4_;
          local_180._20_4_ = local_180._0_4_;
          local_180._24_4_ = local_180._0_4_;
          local_180._28_4_ = local_180._0_4_;
          uStack_15c = local_160;
          uStack_158 = local_160;
          uStack_154 = local_160;
          uStack_150 = local_160;
          uStack_14c = local_160;
          uStack_148 = local_160;
          uStack_144 = local_160;
          local_140._0_4_ = local_140._4_4_;
          local_140._8_4_ = local_140._4_4_;
          local_140._12_4_ = local_140._4_4_;
          local_140._16_4_ = local_140._4_4_;
          local_140._20_4_ = local_140._4_4_;
          local_140._24_4_ = local_140._4_4_;
          local_140._28_4_ = local_140._4_4_;
          local_100 = ZEXT432(0) << 0x20;
          local_120 = ZEXT432(0) << 0x20;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = auStack_b0;
          uStack_9c = context->user->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = context->user->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          uVar16 = *(undefined4 *)(ray + k * 4 + 0x100);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + lVar24 * 4);
          local_320 = *(undefined8 *)(mm_lookupmask_ps + uVar19);
          uStack_318 = *(undefined8 *)(mm_lookupmask_ps + uVar19 + 8);
          local_310 = *(undefined8 *)local_1c0._0_8_;
          uStack_308 = *(undefined8 *)(local_1c0._0_8_ + 8);
          local_2f0 = &local_320;
          local_2e8 = pGVar2->userPtr;
          local_2e0 = context->user;
          local_2c8 = 8;
          pRVar17 = (RayHitK<8> *)pGVar2->intersectionFilterN;
          if (pRVar17 != (RayHitK<8> *)0x0) {
            local_340 = auVar66._0_16_;
            local_328 = sphere;
            local_250 = auVar54;
            local_240 = auVar53;
            local_230 = auVar33;
            local_220 = auVar50;
            local_210 = auVar36;
            local_200 = auVar52;
            local_1f0 = auVar51;
            local_1e0 = auVar75;
            local_1d0 = auVar63;
            pRVar17 = (RayHitK<8> *)(*(code *)pRVar17)(&local_2f0);
            auVar80 = ZEXT1664(local_250);
            auVar79 = ZEXT1664(local_240);
            auVar78 = ZEXT1664(local_230);
            auVar73 = ZEXT1664(local_220);
            auVar71 = ZEXT1664(local_210);
            auVar69 = ZEXT1664(local_200);
            auVar77 = ZEXT1664(local_1f0);
            auVar76 = ZEXT1664(local_1e0);
            auVar74 = ZEXT1664(local_1d0);
            auVar64 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            auVar66 = ZEXT1664(local_340);
            context = local_348;
            sphere = local_328;
            pSVar21 = local_350;
          }
          auVar75._8_8_ = uStack_318;
          auVar75._0_8_ = local_320;
          auVar52 = vpcmpeqd_avx((undefined1  [16])0x0,auVar75);
          auVar10._8_8_ = uStack_308;
          auVar10._0_8_ = local_310;
          auVar36 = vpcmpeqd_avx((undefined1  [16])0x0,auVar10);
          auVar28._16_16_ = auVar36;
          auVar28._0_16_ = auVar52;
          auVar28 = local_280 & ~auVar28;
          auVar61 = ZEXT1664(local_300);
          if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar28 >> 0x7f,0) == '\0') &&
                (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar28 >> 0xbf,0) == '\0') &&
              (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar28[0x1f]) {
            auVar29._0_4_ = auVar52._0_4_ ^ local_280._0_4_;
            auVar29._4_4_ = auVar52._4_4_ ^ local_280._4_4_;
            auVar29._8_4_ = auVar52._8_4_ ^ local_280._8_4_;
            auVar29._12_4_ = auVar52._12_4_ ^ local_280._12_4_;
            auVar29._16_4_ = auVar36._0_4_ ^ local_280._16_4_;
            auVar29._20_4_ = auVar36._4_4_ ^ local_280._20_4_;
            auVar29._24_4_ = auVar36._8_4_ ^ local_280._24_4_;
            auVar29._28_4_ = auVar36._12_4_ ^ local_280._28_4_;
          }
          else {
            pRVar17 = (RayHitK<8> *)context->args->filter;
            if ((pRVar17 != (RayHitK<8> *)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
              local_340 = auVar66._0_16_;
              local_1d0 = auVar74._0_16_;
              local_1e0 = auVar76._0_16_;
              local_1f0 = auVar77._0_16_;
              local_200 = auVar69._0_16_;
              local_210 = auVar71._0_16_;
              local_220 = auVar73._0_16_;
              local_230 = auVar78._0_16_;
              local_240 = auVar79._0_16_;
              local_250 = auVar80._0_16_;
              pRVar17 = (RayHitK<8> *)(*(code *)pRVar17)(&local_2f0);
              auVar61 = ZEXT1664(local_300);
              auVar80 = ZEXT1664(local_250);
              auVar79 = ZEXT1664(local_240);
              auVar78 = ZEXT1664(local_230);
              auVar73 = ZEXT1664(local_220);
              auVar71 = ZEXT1664(local_210);
              auVar69 = ZEXT1664(local_200);
              auVar77 = ZEXT1664(local_1f0);
              auVar76 = ZEXT1664(local_1e0);
              auVar74 = ZEXT1664(local_1d0);
              auVar64 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar66 = ZEXT1664(local_340);
              context = local_348;
              pSVar21 = local_350;
            }
            auVar7._8_8_ = uStack_318;
            auVar7._0_8_ = local_320;
            auVar52 = vpcmpeqd_avx((undefined1  [16])0x0,auVar7);
            auVar11._8_8_ = uStack_308;
            auVar11._0_8_ = local_310;
            auVar36 = vpcmpeqd_avx((undefined1  [16])0x0,auVar11);
            auVar38._16_16_ = auVar36;
            auVar38._0_16_ = auVar52;
            auVar29._0_4_ = auVar52._0_4_ ^ local_280._0_4_;
            auVar29._4_4_ = auVar52._4_4_ ^ local_280._4_4_;
            auVar29._8_4_ = auVar52._8_4_ ^ local_280._8_4_;
            auVar29._12_4_ = auVar52._12_4_ ^ local_280._12_4_;
            auVar29._16_4_ = auVar36._0_4_ ^ local_280._16_4_;
            auVar29._20_4_ = auVar36._4_4_ ^ local_280._20_4_;
            auVar29._24_4_ = auVar36._8_4_ ^ local_280._24_4_;
            auVar29._28_4_ = auVar36._12_4_ ^ local_280._28_4_;
            auVar28 = local_280 & ~auVar38;
            if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar28 >> 0x7f,0) != '\0') ||
                  (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar28 >> 0xbf,0) != '\0') ||
                (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar28[0x1f] < '\0') {
              auVar28 = vmaskmovps_avx(auVar29,*local_2d0);
              *(undefined1 (*) [32])(local_2d8 + 0x180) = auVar28;
              auVar28 = vmaskmovps_avx(auVar29,local_2d0[1]);
              *(undefined1 (*) [32])(local_2d8 + 0x1a0) = auVar28;
              auVar28 = vmaskmovps_avx(auVar29,local_2d0[2]);
              *(undefined1 (*) [32])(local_2d8 + 0x1c0) = auVar28;
              auVar28 = vmaskmovps_avx(auVar29,local_2d0[3]);
              *(undefined1 (*) [32])(local_2d8 + 0x1e0) = auVar28;
              auVar28 = vmaskmovps_avx(auVar29,local_2d0[4]);
              *(undefined1 (*) [32])(local_2d8 + 0x200) = auVar28;
              auVar28 = vmaskmovps_avx(auVar29,local_2d0[5]);
              *(undefined1 (*) [32])(local_2d8 + 0x220) = auVar28;
              auVar28 = vmaskmovps_avx(auVar29,local_2d0[6]);
              *(undefined1 (*) [32])(local_2d8 + 0x240) = auVar28;
              auVar28 = vmaskmovps_avx(auVar29,local_2d0[7]);
              *(undefined1 (*) [32])(local_2d8 + 0x260) = auVar28;
              auVar28 = vmaskmovps_avx(auVar29,local_2d0[8]);
              *(undefined1 (*) [32])(local_2d8 + 0x280) = auVar28;
              pRVar17 = local_2d8;
            }
          }
          if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar29 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar29 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar29 >> 0x7f,0) == '\0') &&
                (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar29 >> 0xbf,0) == '\0') &&
              (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar29[0x1f]) {
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar16;
          }
          *(undefined4 *)(local_360 + lVar24 * 4) = 0;
          uVar16 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar25._4_4_ = uVar16;
          auVar25._0_4_ = uVar16;
          auVar25._8_4_ = uVar16;
          auVar25._12_4_ = uVar16;
          auVar52 = vcmpps_avx(auVar61._0_16_,auVar25,2);
          local_360 = vandps_avx(auVar52,local_360);
        }
        uVar16 = (undefined4)((ulong)pRVar17 >> 0x20);
        auVar50 = auVar73._0_16_;
        auVar52 = auVar69._0_16_;
        auVar36 = auVar71._0_16_;
        auVar51 = auVar77._0_16_;
        auVar75 = auVar76._0_16_;
        auVar33 = auVar78._0_16_;
        auVar63 = auVar74._0_16_;
        auVar54 = auVar80._0_16_;
        auVar53 = auVar79._0_16_;
        if ((((local_360 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (local_360 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (local_360 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            -1 < local_360[0xf]) goto LAB_00fb780b;
        auVar52 = vblendvps_avx(auVar64._0_16_,auVar61._0_16_,local_360);
        auVar36 = vshufps_avx(auVar52,auVar52,0xb1);
        auVar36 = vminps_avx(auVar36,auVar52);
        auVar50 = vshufpd_avx(auVar36,auVar36,1);
        auVar36 = vminps_avx(auVar50,auVar36);
        auVar36 = vcmpps_avx(auVar52,auVar36,0);
        auVar50 = local_360 & auVar36;
        auVar52 = local_360;
        if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar50[0xf] < '\0') {
          auVar52 = vandps_avx(auVar36,local_360);
        }
        uVar15 = vmovmskps_avx(auVar52);
        lVar24 = 0;
        if (CONCAT44(uVar16,uVar15) != 0) {
          for (; (CONCAT44(uVar16,uVar15) >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom, ray.time()[k]);
        const vbool<M> valid = sphere.valid();
        SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Intersect1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }